

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void rotate_matrix(float angle,float x,float y,float z,float *r)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float local_64;
  int local_48;
  int local_44;
  int j;
  int i;
  float length;
  float u [3];
  float c1;
  float s;
  float c;
  float radians;
  float *r_local;
  float z_local;
  float y_local;
  float x_local;
  float angle_local;
  
  fVar2 = (float)SDL_cosf();
  u[2] = (float)SDL_sinf();
  fVar3 = (float)SDL_cosf();
  u[1] = 1.0 - fVar3;
  dVar4 = (double)SDL_sqrt((double)(z * z + x * x + y * y));
  fVar3 = (float)dVar4;
  i = (int)(x / fVar3);
  length = y / fVar3;
  u[0] = z / fVar3;
  for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
    r[local_44] = 0.0;
  }
  r[0xf] = 1.0;
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    r[local_44 * 4 + (local_44 + 1) % 3] = (float)(&i)[(local_44 + 2) % 3] * u[2];
    r[local_44 * 4 + (local_44 + 2) % 3] = -(float)(&i)[(local_44 + 1) % 3] * u[2];
  }
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      local_64 = fVar2;
      if (local_44 != local_48) {
        local_64 = 0.0;
      }
      iVar1 = local_44 * 4 + local_48;
      r[iVar1] = u[1] * (float)(&i)[local_44] * (float)(&i)[local_48] + local_64 + r[iVar1];
    }
  }
  return;
}

Assistant:

static void
rotate_matrix(float angle, float x, float y, float z, float *r)
{
    float radians, c, s, c1, u[3], length;
    int i, j;

    radians = (float)(angle * M_PI) / 180.0f;

    c = SDL_cosf(radians);
    s = SDL_sinf(radians);

    c1 = 1.0f - SDL_cosf(radians);

    length = (float)SDL_sqrt(x * x + y * y + z * z);

    u[0] = x / length;
    u[1] = y / length;
    u[2] = z / length;

    for (i = 0; i < 16; i++) {
        r[i] = 0.0;
    }

    r[15] = 1.0;

    for (i = 0; i < 3; i++) {
        r[i * 4 + (i + 1) % 3] = u[(i + 2) % 3] * s;
        r[i * 4 + (i + 2) % 3] = -u[(i + 1) % 3] * s;
    }

    for (i = 0; i < 3; i++) {
        for (j = 0; j < 3; j++) {
            r[i * 4 + j] += c1 * u[i] * u[j] + (i == j ? c : 0.0f);
        }
    }
}